

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O2

int actorpp::detail::
    readable_channel<std::vector<unsigned_char,std::allocator<unsigned_char>>,actorpp::CloseReason>
              (int i,Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *c,
              Channel<actorpp::CloseReason> *chans)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  
  peVar1 = (c->impl).
           super___shared_ptr<actorpp::detail::ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (((iterator *)
      ((long)&(peVar1->elements).c.
              super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl + 0x30))->_M_cur !=
      ((iterator *)
      ((long)&(peVar1->elements).c.
              super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl + 0x10))->_M_cur) {
    return i;
  }
  iVar3 = i + 1;
  peVar2 = (chans->impl).
           super___shared_ptr<actorpp::detail::ChannelImpl<actorpp::CloseReason>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (((iterator *)
      ((long)&(peVar2->elements).c.
              super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>._M_impl
      + 0x30))->_M_cur ==
      ((iterator *)
      ((long)&(peVar2->elements).c.
              super__Deque_base<actorpp::CloseReason,_std::allocator<actorpp::CloseReason>_>._M_impl
      + 0x10))->_M_cur) {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int readable_channel(int i, Channel<T> &c, Channel<Ttail> &...chans) {
  if (c.readable_with_lock())
    return i;
  else
    return readable_channel(i + 1, chans...);
}